

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O2

void composition_clear(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (const_alpha == 0xff) {
    plutovg_memfill32(dest,length,0);
    return;
  }
  uVar3 = 0;
  uVar2 = (ulong)(uint)length;
  if (length < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    uVar1 = BYTE_MUL(dest[uVar3],0xff - const_alpha);
    dest[uVar3] = uVar1;
  }
  return;
}

Assistant:

static void composition_clear(uint32_t* dest, int length, const uint32_t* src, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        plutovg_memfill32(dest, length, 0);
    } else {
        uint32_t ialpha = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(dest[i], ialpha);
        }
    }
}